

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-pico.c
# Opt level: O0

void pico_on_acked(quicly_cc_t *cc,quicly_loss_t *loss,uint32_t bytes,uint64_t largest_acked,
                  uint32_t inflight,int64_t now,uint32_t max_udp_payload_size)

{
  uint32_t uVar1;
  uint uVar2;
  ulong in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  uint32_t count;
  uint32_t bytes_per_mtu_increase;
  
  if (in_R8D < in_EDX) {
    __assert_fail("inflight >= bytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/cc-pico.c"
                  ,0x31,
                  "void pico_on_acked(quicly_cc_t *, const quicly_loss_t *, uint32_t, uint64_t, uint32_t, int64_t, uint32_t)"
                 );
  }
  if (*(ulong *)(in_RDI + 0x10) <= in_RCX) {
    *(uint *)(in_RDI + 0x18) = in_EDX + *(int *)(in_RDI + 0x18);
    uVar1 = calc_bytes_per_mtu_increase
                      (*(uint32_t *)(in_RDI + 8),*(uint32_t *)(in_RDI + 0xc),
                       *(uint32_t *)(in_RSI + 100),(uint32_t)now);
    if (uVar1 <= *(uint *)(in_RDI + 0x18)) {
      uVar2 = *(uint *)(in_RDI + 0x18) / uVar1;
      *(uint *)(in_RDI + 8) = uVar2 * (uint32_t)now + *(int *)(in_RDI + 8);
      *(uint *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) - uVar2 * uVar1;
      if (*(uint *)(in_RDI + 0x44) < *(uint *)(in_RDI + 8)) {
        *(undefined4 *)(in_RDI + 0x44) = *(undefined4 *)(in_RDI + 8);
      }
    }
  }
  return;
}

Assistant:

static void pico_on_acked(quicly_cc_t *cc, const quicly_loss_t *loss, uint32_t bytes, uint64_t largest_acked, uint32_t inflight,
                          int64_t now, uint32_t max_udp_payload_size)
{
    assert(inflight >= bytes);

    /* Do not increase congestion window while in recovery. */
    if (largest_acked < cc->recovery_end)
        return;

    cc->state.reno.stash += bytes;

    /* Calculate the amount of bytes required to be acked for incrementing CWND by one MTU. */
    uint32_t bytes_per_mtu_increase = calc_bytes_per_mtu_increase(cc->cwnd, cc->ssthresh, loss->rtt.smoothed, max_udp_payload_size);

    /* Bail out if we do not yet have enough bytes being acked. */
    if (cc->state.reno.stash < bytes_per_mtu_increase)
        return;

    /* Update CWND, reducing stash relative to the amount we've adjusted the CWND */
    uint32_t count = cc->state.reno.stash / bytes_per_mtu_increase;
    cc->cwnd += count * max_udp_payload_size;
    cc->state.reno.stash -= count * bytes_per_mtu_increase;

    if (cc->cwnd_maximum < cc->cwnd)
        cc->cwnd_maximum = cc->cwnd;
}